

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O2

Polynom<Rational> __thiscall Polynom<Rational>::power(Polynom<Rational> *this,BigInteger *pow)

{
  Rational *extraout_RDX;
  bool bVar1;
  Polynom<Rational> PVar2;
  Polynom<Rational> a;
  BigInteger p;
  
  Rational::Rational((Rational *)&p,1);
  Polynom(this,(Rational *)&p);
  Rational::~Rational((Rational *)&p);
  Matrix<Rational>::Matrix(&a.m,(Matrix<Rational> *)pow);
  abs((int)&p);
  bVar1 = false;
  while (p.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start !=
         p.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    if ((*p.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start & 1) != 0) {
      if (bVar1) {
        bVar1 = true;
        operator*=(this,&a);
      }
      else {
        bVar1 = true;
        Matrix<Rational>::operator=(&this->m,&a.m);
      }
    }
    BigInteger::_divide_by_2(&p);
    if (p.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        p.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      operator*=(&a,&a);
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p);
  Matrix<Rational>::~Matrix(&a.m);
  PVar2.m.arr = extraout_RDX;
  PVar2.m._0_8_ = this;
  return (Polynom<Rational>)PVar2.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::power(const BigInteger &pow) const
{
    Polynom t = Polynom(Field(1));
    bool t_set = false;
    Polynom a(*this);
    BigInteger p = abs(pow);
    while(p)
    {
        if(p.odd())
        {
            if(t_set)
                t *= a;
            else
                t = a;
            t_set = true;
        }
        p._divide_by_2();
        if(p)
            a *= a;
    }
    return t;
}